

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O3

bool __thiscall
Js::SimpleTypeHandler<6UL>::IsObjTypeSpecEquivalent
          (SimpleTypeHandler<6UL> *this,Type *type,TypeEquivalenceRecord *record,
          uint *failedPropertyIndex)

{
  bool bVar1;
  ulong uVar2;
  EquivalentPropertyEntry *entry;
  
  if (record->propertyCount != 0) {
    entry = record->properties;
    uVar2 = 0;
    do {
      bVar1 = IsObjTypeSpecEquivalent(this,type,entry);
      if (!bVar1) {
        *failedPropertyIndex = (uint)uVar2;
        return false;
      }
      uVar2 = uVar2 + 1;
      entry = entry + 1;
    } while (uVar2 < record->propertyCount);
  }
  return true;
}

Assistant:

bool SimpleTypeHandler<size>::IsObjTypeSpecEquivalent(const Type* type, const TypeEquivalenceRecord& record, uint& failedPropertyIndex)
    {
        Js::EquivalentPropertyEntry* properties = record.properties;
        for (uint pi = 0; pi < record.propertyCount; pi++)
        {
            const EquivalentPropertyEntry* refInfo = &properties[pi];
            if (!this->SimpleTypeHandler<size>::IsObjTypeSpecEquivalent(type, refInfo))
            {
                failedPropertyIndex = pi;
                return false;
            }
        }

        return true;
    }